

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractstringserialiser.cpp
# Opt level: O0

QString * __thiscall
AbstractStringSerialiserPrivate::saveVariant
          (QString *__return_storage_ptr__,AbstractStringSerialiserPrivate *this,QVariant *val)

{
  int iVar1;
  ulong uVar2;
  DateFormat DVar3;
  double val_00;
  QBitmap local_168;
  QImage local_150 [24];
  undefined1 local_138 [48];
  QImage local_108 [24];
  QDateTime local_f0 [12];
  undefined4 local_e4;
  undefined8 local_e0;
  QFlags<QByteArray::Base64Option> local_d4;
  QByteArray local_d0;
  QByteArray local_b8;
  ushort local_9c;
  byte local_99;
  QArrayDataPointer<char16_t> local_98;
  byte local_69;
  QArrayDataPointer<char16_t> local_68;
  QVariant *local_50;
  QVariant *val_local;
  AbstractStringSerialiserPrivate *this_local;
  char16_t *local_38;
  char16_t *str_1;
  QArrayDataPointer<char16_t> *local_28;
  char16_t *local_20;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_10;
  
  local_50 = val;
  val_local = (QVariant *)this;
  this_local = (AbstractStringSerialiserPrivate *)__return_storage_ptr__;
  uVar2 = ::QVariant::isNull();
  if ((uVar2 & 1) != 0) {
    QString::QString(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  iVar1 = ::QVariant::userType(local_50);
  if (iVar1 == 0) {
    QString::QString(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if (iVar1 == 1) {
    uVar2 = ::QVariant::toBool();
    local_69 = 0;
    local_99 = 0;
    if ((uVar2 & 1) == 0) {
      local_28 = &local_98;
      str_1 = L"0";
      local_38 = L"0";
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_98,(Data *)0x0,L"0",1);
      local_99 = 1;
      QString::QString(__return_storage_ptr__,&local_98);
    }
    else {
      str = L"1";
      local_20 = L"1";
      local_10 = &local_68;
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_68,(Data *)0x0,L"1",1);
      local_69 = 1;
      QString::QString(__return_storage_ptr__,&local_68);
    }
    if ((local_99 & 1) != 0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    }
    if ((local_69 & 1) != 0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      return __return_storage_ptr__;
    }
    return __return_storage_ptr__;
  }
  DVar3 = (DateFormat)__return_storage_ptr__;
  if (iVar1 != 2) {
    if (iVar1 == 3) {
LAB_0012ea6a:
      iVar1 = ::QVariant::toUInt((bool *)local_50);
      QString::number(DVar3,iVar1);
      return __return_storage_ptr__;
    }
    if (iVar1 == 4) {
      iVar1 = ::QVariant::toLongLong((bool *)local_50);
      QString::number((longlong)__return_storage_ptr__,iVar1);
      return __return_storage_ptr__;
    }
    if (iVar1 == 5) {
      iVar1 = ::QVariant::toULongLong((bool *)local_50);
      QString::number((ulonglong)__return_storage_ptr__,iVar1);
      return __return_storage_ptr__;
    }
    if (iVar1 == 6) {
LAB_0012eadb:
      val_00 = (double)::QVariant::toDouble((bool *)local_50);
      guessDecimalsString(__return_storage_ptr__,val_00,(QLocale *)0x0);
      return __return_storage_ptr__;
    }
    if (iVar1 == 7) {
      local_9c = ::QVariant::toChar();
      QString::QString(__return_storage_ptr__,(QChar *)(ulong)local_9c);
      return __return_storage_ptr__;
    }
    if (iVar1 == 10) {
      ::QVariant::toString();
      return __return_storage_ptr__;
    }
    if (iVar1 == 0xc) {
      ::QVariant::toByteArray();
      QFlags<QByteArray::Base64Option>::QFlags(&local_d4,Base64Encoding);
      QByteArray::toBase64((QFlags_conflict1 *)&local_b8);
      QString::fromLatin1<void>(__return_storage_ptr__,&local_b8);
      QByteArray::~QByteArray(&local_b8);
      QByteArray::~QByteArray(&local_d0);
      return __return_storage_ptr__;
    }
    if (iVar1 == 0xe) {
      local_e0 = ::QVariant::toDate();
      QDate::toString(DVar3);
      return __return_storage_ptr__;
    }
    if (iVar1 == 0xf) {
      local_e4 = ::QVariant::toTime();
      QTime::toString(DVar3);
      return __return_storage_ptr__;
    }
    if (iVar1 == 0x10) {
      ::QVariant::toDateTime();
      QDateTime::toString(DVar3);
      QDateTime::~QDateTime(local_f0);
      return __return_storage_ptr__;
    }
    if (2 < iVar1 - 0x20U) {
      if (iVar1 - 0x23U < 3) goto LAB_0012ea6a;
      if (iVar1 == 0x26) goto LAB_0012eadb;
      if (iVar1 != 0x28) {
        if (iVar1 == 0x1001) {
          ::QVariant::value<QPixmap>((QVariant *)local_138);
          QPixmap::toImage();
          saveImageVariant(__return_storage_ptr__,(QImage *)(local_138 + 0x18));
          QImage::~QImage((QImage *)(local_138 + 0x18));
          QPixmap::~QPixmap((QPixmap *)local_138);
          return __return_storage_ptr__;
        }
        if (iVar1 == 0x1006) {
          ::QVariant::value<QImage>((QVariant *)local_108);
          saveImageVariant(__return_storage_ptr__,local_108);
          QImage::~QImage(local_108);
          return __return_storage_ptr__;
        }
        if (iVar1 == 0x1009) {
          ::QVariant::value<QBitmap>(&local_168,local_50);
          QPixmap::toImage();
          saveImageVariant(__return_storage_ptr__,local_150);
          QImage::~QImage(local_150);
          QBitmap::~QBitmap(&local_168);
          return __return_storage_ptr__;
        }
        variantToString(__return_storage_ptr__,this,local_50);
        return __return_storage_ptr__;
      }
    }
  }
  iVar1 = ::QVariant::toInt((bool *)local_50);
  QString::number(DVar3,iVar1);
  return __return_storage_ptr__;
}

Assistant:

QString AbstractStringSerialiserPrivate::saveVariant(const QVariant &val) const
{
    if (val.isNull())
        return QString();
    switch (val.userType()) {
    case QMetaType::UnknownType:
        Q_ASSERT_X(false, "ModelSerialisation::saveVariant", "Trying to save unregistered type.");
        return QString();
    case QMetaType::Bool:
        return val.toBool() ? QStringLiteral("1") : QStringLiteral("0");
    case QMetaType::Long:
    case QMetaType::Short:
    case QMetaType::Char:
    case QMetaType::SChar:
    case QMetaType::Int:
        return QString::number(val.toInt());
    case QMetaType::ULong:
    case QMetaType::UShort:
    case QMetaType::UChar:
    case QMetaType::UInt:
        return QString::number(val.toUInt());
    case QMetaType::LongLong:
        return QString::number(val.toLongLong());
    case QMetaType::ULongLong:
        return QString::number(val.toULongLong());
    case QMetaType::Double:
    case QMetaType::Float:
        return guessDecimalsString(val.toDouble());
    case QMetaType::QChar:
        return QString(val.toChar());
    case QMetaType::QString:
        return val.toString();
    case QMetaType::QByteArray:
        return QString::fromLatin1(val.toByteArray().toBase64());
    case QMetaType::QDate:
        return val.toDate().toString(Qt::ISODate);
    case QMetaType::QTime:
        return val.toTime().toString(Qt::ISODate);
    case QMetaType::QDateTime:
        return val.toDateTime().toString(Qt::ISODate);
#ifdef QT_GUI_LIB
    case QMetaType::QImage:
        return saveImageVariant(val.value<QImage>());
    case QMetaType::QPixmap:
        return saveImageVariant(val.value<QPixmap>().toImage());
    case QMetaType::QBitmap:
        return saveImageVariant(val.value<QBitmap>().toImage());
#endif
    default:
        return variantToString(val);
    }
}